

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O1

int Abc_NtkSubDagSize_rec(Abc_Obj_t *pObj,Vec_Int_t *vAttrs)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int Fill;
  long in_RDX;
  int iVar7;
  
  iVar6 = 0;
  while( true ) {
    pAVar2 = pObj->pNtk;
    iVar5 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,(int)in_RDX);
    if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) break;
    pAVar3 = pObj->pNtk;
    iVar1 = pAVar3->nTravIds;
    iVar7 = 0;
    if ((pAVar2->vTravIds).pArray[iVar5] == iVar1) {
LAB_002a23ed:
      return iVar7 + iVar6;
    }
    iVar5 = pObj->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
    if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar3->vTravIds).pArray[iVar5] = iVar1;
    iVar5 = pObj->Id;
    if (((long)iVar5 < 0) || (vAttrs->nSize <= iVar5)) break;
    if (vAttrs->pArray[iVar5] != 0) goto LAB_002a23ed;
    uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
    iVar7 = 1;
    if ((uVar4 == 2) || (uVar4 == 5)) goto LAB_002a23ed;
    if ((pObj->vFanins).nSize != 2) {
      __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                    ,0x291,"int Abc_NtkSubDagSize_rec(Abc_Obj_t *, Vec_Int_t *)");
    }
    iVar5 = Abc_NtkSubDagSize_rec
                      ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vAttrs);
    in_RDX = (long)(pObj->vFanins).pArray[1];
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[in_RDX];
    iVar6 = iVar6 + iVar5 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_NtkSubDagSize_rec( Abc_Obj_t * pObj, Vec_Int_t * vAttrs ) 
{
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Vec_IntEntry( vAttrs, pObj->Id ) )
        return 0;
    if ( Abc_ObjIsCi(pObj) )
        return 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    return 1 + Abc_NtkSubDagSize_rec(Abc_ObjFanin0(pObj), vAttrs) +
        Abc_NtkSubDagSize_rec(Abc_ObjFanin1(pObj), vAttrs);
}